

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O1

void __thiscall QTabBar::setTabEnabled(QTabBar *this,int index,bool enabled)

{
  QTabBarPrivate *this_00;
  long lVar1;
  int index_00;
  Tab *pTVar2;
  ulong uVar3;
  
  this_00 = *(QTabBarPrivate **)&(this->super_QWidget).field_0x8;
  if ((ulong)(long)index < (ulong)(this_00->tabList).d.size) {
    pTVar2 = (this_00->tabList).d.ptr[index];
  }
  else {
    pTVar2 = (Tab *)0x0;
  }
  if (pTVar2 != (Tab *)0x0) {
    pTVar2->field_0xe4 = pTVar2->field_0xe4 & 0xfe | enabled;
    QWidget::setShortcutEnabled(&this->super_QWidget,pTVar2->shortcutId,enabled);
    QWidget::update(&this->super_QWidget);
    if (!enabled) {
      if (this_00->currentIndex == index) {
        index = index + 1;
        goto LAB_00494542;
      }
      if (!enabled) {
        return;
      }
    }
    uVar3 = (ulong)this_00->currentIndex;
    if ((((long)uVar3 < 0) ||
        (lVar1 = *(long *)&(this->super_QWidget).field_0x8, *(ulong *)(lVar1 + 0x2e8) <= uVar3)) ||
       ((*(byte *)(*(long *)(*(long *)(lVar1 + 0x2e0) + uVar3 * 8) + 0xe4) & 2) == 0)) {
LAB_00494542:
      index_00 = QTabBarPrivate::selectNewCurrentIndexFrom(this_00,index);
      setCurrentIndex(this,index_00);
      return;
    }
  }
  return;
}

Assistant:

void QTabBar::setTabEnabled(int index, bool enabled)
{
    Q_D(QTabBar);
    if (QTabBarPrivate::Tab *tab = d->at(index)) {
        tab->enabled = enabled;
#ifndef QT_NO_SHORTCUT
        setShortcutEnabled(tab->shortcutId, enabled);
#endif
        update();
        if (!enabled && index == d->currentIndex)
            setCurrentIndex(d->selectNewCurrentIndexFrom(index+1));
        else if (enabled && !isTabVisible(d->currentIndex))
            setCurrentIndex(d->selectNewCurrentIndexFrom(index));
    }
}